

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTMLparser.c
# Opt level: O0

int htmlCheckAutoClose(xmlChar *newtag,xmlChar *oldtag)

{
  void *pvVar1;
  void *res;
  htmlStartCloseEntry key;
  xmlChar *oldtag_local;
  xmlChar *newtag_local;
  
  res = oldtag;
  key.oldTag = (char *)newtag;
  key.newTag = (char *)oldtag;
  pvVar1 = bsearch(&res,htmlStartClose,0xfb,0x10,htmlCompareStartClose);
  return (int)(pvVar1 != (void *)0x0);
}

Assistant:

static int
htmlCheckAutoClose(const xmlChar * newtag, const xmlChar * oldtag)
{
    htmlStartCloseEntry key;
    void *res;

    key.oldTag = (const char *) oldtag;
    key.newTag = (const char *) newtag;
    res = bsearch(&key, htmlStartClose,
            sizeof(htmlStartClose) / sizeof(htmlStartCloseEntry),
            sizeof(htmlStartCloseEntry), htmlCompareStartClose);
    return(res != NULL);
}